

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5_utils.c
# Opt level: O2

void MD5Transform(uint *buf,uint *in)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  
  uVar1 = buf[1];
  uVar2 = buf[2];
  uVar3 = buf[3];
  uVar17 = *in;
  uVar24 = in[1];
  uVar4 = ((uVar3 ^ uVar2) & uVar1 ^ uVar3) + *buf + uVar17 + 0xd76aa478;
  uVar5 = (uVar4 * 0x80 | uVar4 >> 0x19) + uVar1;
  uVar4 = ((uVar2 ^ uVar1) & uVar5 ^ uVar2) + uVar3 + uVar24 + 0xe8c7b756;
  uVar9 = (uVar4 * 0x1000 | uVar4 >> 0x14) + uVar5;
  uVar4 = in[2];
  uVar12 = ((uVar5 ^ uVar1) & uVar9 ^ uVar1) + uVar4 + uVar2 + 0x242070db;
  uVar13 = (uVar12 * 0x20000 | uVar12 >> 0xf) + uVar9;
  uVar12 = in[3];
  uVar21 = uVar1 + uVar12 + ((uVar9 ^ uVar5) & uVar13 ^ uVar5) + 0xc1bdceee;
  uVar22 = (uVar21 * 0x400000 | uVar21 >> 10) + uVar13;
  uVar21 = in[4];
  uVar5 = uVar5 + uVar21 + ((uVar13 ^ uVar9) & uVar22 ^ uVar9) + 0xf57c0faf;
  uVar6 = (uVar5 * 0x80 | uVar5 >> 0x19) + uVar22;
  uVar5 = in[5];
  uVar9 = uVar9 + uVar5 + ((uVar22 ^ uVar13) & uVar6 ^ uVar13) + 0x4787c62a;
  uVar10 = (uVar9 * 0x1000 | uVar9 >> 0x14) + uVar6;
  uVar9 = in[6];
  uVar13 = uVar13 + uVar9 + ((uVar6 ^ uVar22) & uVar10 ^ uVar22) + 0xa8304613;
  uVar14 = (uVar13 * 0x20000 | uVar13 >> 0xf) + uVar10;
  uVar13 = in[7];
  uVar22 = uVar22 + uVar13 + ((uVar10 ^ uVar6) & uVar14 ^ uVar6) + 0xfd469501;
  uVar23 = (uVar22 * 0x400000 | uVar22 >> 10) + uVar14;
  uVar22 = in[8];
  uVar6 = uVar6 + uVar22 + ((uVar14 ^ uVar10) & uVar23 ^ uVar10) + 0x698098d8;
  uVar7 = (uVar6 * 0x80 | uVar6 >> 0x19) + uVar23;
  uVar6 = in[9];
  uVar10 = uVar10 + uVar6 + ((uVar23 ^ uVar14) & uVar7 ^ uVar14) + 0x8b44f7af;
  uVar11 = (uVar10 * 0x1000 | uVar10 >> 0x14) + uVar7;
  uVar10 = in[10];
  uVar14 = (uVar14 + uVar10 + ((uVar7 ^ uVar23) & uVar11 ^ uVar23)) - 0xa44f;
  uVar15 = (uVar14 * 0x20000 | uVar14 >> 0xf) + uVar11;
  uVar14 = in[0xb];
  uVar23 = ((uVar11 ^ uVar7) & uVar15 ^ uVar7) + uVar23 + uVar14 + 0x895cd7be;
  uVar18 = (uVar23 * 0x400000 | uVar23 >> 10) + uVar15;
  uVar23 = in[0xc];
  uVar7 = uVar7 + uVar23 + ((uVar15 ^ uVar11) & uVar18 ^ uVar11) + 0x6b901122;
  uVar8 = (uVar7 * 0x80 | uVar7 >> 0x19) + uVar18;
  uVar7 = in[0xd];
  uVar11 = ((uVar18 ^ uVar15) & uVar8 ^ uVar15) + uVar11 + uVar7 + 0xfd987193;
  uVar20 = (uVar11 * 0x1000 | uVar11 >> 0x14) + uVar8;
  uVar11 = in[0xe];
  uVar15 = uVar15 + uVar11 + ((uVar8 ^ uVar18) & uVar20 ^ uVar18) + 0xa679438e;
  uVar16 = (uVar15 * 0x20000 | uVar15 >> 0xf) + uVar20;
  uVar15 = in[0xf];
  uVar18 = uVar18 + uVar15 + ((uVar20 ^ uVar8) & uVar16 ^ uVar8) + 0x49b40821;
  uVar19 = (uVar18 * 0x400000 | uVar18 >> 10) + uVar16;
  uVar8 = uVar8 + uVar24 + ((uVar19 ^ uVar16) & uVar20 ^ uVar16) + 0xf61e2562;
  uVar8 = (uVar8 * 0x20 | uVar8 >> 0x1b) + uVar19;
  uVar18 = ((uVar8 ^ uVar19) & uVar16 ^ uVar19) + uVar20 + uVar9 + 0xc040b340;
  uVar18 = (uVar18 * 0x200 | uVar18 >> 0x17) + uVar8;
  uVar16 = uVar16 + uVar14 + ((uVar18 ^ uVar8) & uVar19 ^ uVar8) + 0x265e5a51;
  uVar16 = (uVar16 * 0x4000 | uVar16 >> 0x12) + uVar18;
  uVar19 = uVar19 + uVar17 + ((uVar16 ^ uVar18) & uVar8 ^ uVar18) + 0xe9b6c7aa;
  uVar19 = (uVar19 * 0x100000 | uVar19 >> 0xc) + uVar16;
  uVar8 = uVar8 + uVar5 + ((uVar19 ^ uVar16) & uVar18 ^ uVar16) + 0xd62f105d;
  uVar8 = (uVar8 * 0x20 | uVar8 >> 0x1b) + uVar19;
  uVar18 = uVar18 + uVar10 + ((uVar8 ^ uVar19) & uVar16 ^ uVar19) + 0x2441453;
  uVar18 = (uVar18 * 0x200 | uVar18 >> 0x17) + uVar8;
  uVar16 = uVar16 + uVar15 + ((uVar18 ^ uVar8) & uVar19 ^ uVar8) + 0xd8a1e681;
  uVar16 = (uVar16 * 0x4000 | uVar16 >> 0x12) + uVar18;
  uVar19 = uVar19 + uVar21 + ((uVar16 ^ uVar18) & uVar8 ^ uVar18) + 0xe7d3fbc8;
  uVar19 = (uVar19 * 0x100000 | uVar19 >> 0xc) + uVar16;
  uVar8 = uVar8 + uVar6 + ((uVar19 ^ uVar16) & uVar18 ^ uVar16) + 0x21e1cde6;
  uVar8 = (uVar8 * 0x20 | uVar8 >> 0x1b) + uVar19;
  uVar18 = uVar18 + uVar11 + ((uVar8 ^ uVar19) & uVar16 ^ uVar19) + 0xc33707d6;
  uVar18 = (uVar18 * 0x200 | uVar18 >> 0x17) + uVar8;
  uVar16 = uVar16 + uVar12 + ((uVar18 ^ uVar8) & uVar19 ^ uVar8) + 0xf4d50d87;
  uVar16 = (uVar16 * 0x4000 | uVar16 >> 0x12) + uVar18;
  uVar19 = uVar19 + uVar22 + ((uVar16 ^ uVar18) & uVar8 ^ uVar18) + 0x455a14ed;
  uVar19 = (uVar19 * 0x100000 | uVar19 >> 0xc) + uVar16;
  uVar8 = uVar8 + uVar7 + ((uVar19 ^ uVar16) & uVar18 ^ uVar16) + 0xa9e3e905;
  uVar8 = (uVar8 * 0x20 | uVar8 >> 0x1b) + uVar19;
  uVar18 = uVar18 + uVar4 + ((uVar8 ^ uVar19) & uVar16 ^ uVar19) + 0xfcefa3f8;
  uVar18 = (uVar18 * 0x200 | uVar18 >> 0x17) + uVar8;
  uVar16 = uVar16 + uVar13 + ((uVar18 ^ uVar8) & uVar19 ^ uVar8) + 0x676f02d9;
  uVar16 = (uVar16 * 0x4000 | uVar16 >> 0x12) + uVar18;
  uVar19 = uVar19 + uVar23 + ((uVar16 ^ uVar18) & uVar8 ^ uVar18) + 0x8d2a4c8a;
  uVar19 = (uVar19 * 0x100000 | uVar19 >> 0xc) + uVar16;
  uVar8 = (uVar8 + uVar5 + (uVar16 ^ uVar18 ^ uVar19)) - 0x5c6be;
  uVar8 = (uVar8 * 0x10 | uVar8 >> 0x1c) + uVar19;
  uVar18 = uVar18 + uVar22 + (uVar19 ^ uVar16 ^ uVar8) + 0x8771f681;
  uVar18 = (uVar18 * 0x800 | uVar18 >> 0x15) + uVar8;
  uVar16 = uVar16 + uVar14 + (uVar8 ^ uVar19 ^ uVar18) + 0x6d9d6122;
  uVar16 = (uVar16 * 0x10000 | uVar16 >> 0x10) + uVar18;
  uVar19 = uVar19 + uVar11 + (uVar18 ^ uVar8 ^ uVar16) + 0xfde5380c;
  uVar19 = (uVar19 * 0x800000 | uVar19 >> 9) + uVar16;
  uVar8 = uVar8 + uVar24 + (uVar16 ^ uVar18 ^ uVar19) + 0xa4beea44;
  uVar8 = (uVar8 * 0x10 | uVar8 >> 0x1c) + uVar19;
  uVar18 = uVar18 + uVar21 + (uVar19 ^ uVar16 ^ uVar8) + 0x4bdecfa9;
  uVar18 = (uVar18 * 0x800 | uVar18 >> 0x15) + uVar8;
  uVar16 = uVar16 + uVar13 + (uVar8 ^ uVar19 ^ uVar18) + 0xf6bb4b60;
  uVar16 = (uVar16 * 0x10000 | uVar16 >> 0x10) + uVar18;
  uVar19 = uVar19 + uVar10 + (uVar18 ^ uVar8 ^ uVar16) + 0xbebfbc70;
  uVar19 = (uVar19 * 0x800000 | uVar19 >> 9) + uVar16;
  uVar8 = uVar8 + uVar7 + (uVar16 ^ uVar18 ^ uVar19) + 0x289b7ec6;
  uVar8 = (uVar8 * 0x10 | uVar8 >> 0x1c) + uVar19;
  uVar18 = uVar18 + uVar17 + (uVar19 ^ uVar16 ^ uVar8) + 0xeaa127fa;
  uVar18 = (uVar18 * 0x800 | uVar18 >> 0x15) + uVar8;
  uVar16 = uVar16 + uVar12 + (uVar8 ^ uVar19 ^ uVar18) + 0xd4ef3085;
  uVar16 = (uVar16 * 0x10000 | uVar16 >> 0x10) + uVar18;
  uVar19 = (uVar18 ^ uVar8 ^ uVar16) + uVar19 + uVar9 + 0x4881d05;
  uVar20 = (uVar19 * 0x800000 | uVar19 >> 9) + uVar16;
  uVar8 = (uVar16 ^ uVar18 ^ uVar20) + uVar8 + uVar6 + 0xd9d4d039;
  uVar19 = (uVar8 * 0x10 | uVar8 >> 0x1c) + uVar20;
  uVar8 = (uVar20 ^ uVar16 ^ uVar19) + uVar18 + uVar23 + 0xe6db99e5;
  uVar8 = (uVar8 * 0x800 | uVar8 >> 0x15) + uVar19;
  uVar18 = (uVar19 ^ uVar20 ^ uVar8) + uVar16 + uVar15 + 0x1fa27cf8;
  uVar18 = (uVar18 * 0x10000 | uVar18 >> 0x10) + uVar8;
  uVar16 = (uVar8 ^ uVar19 ^ uVar18) + uVar20 + uVar4 + 0xc4ac5665;
  uVar16 = (uVar16 * 0x800000 | uVar16 >> 9) + uVar18;
  uVar17 = ((~uVar8 | uVar16) ^ uVar18) + uVar19 + uVar17 + 0xf4292244;
  uVar19 = (uVar17 * 0x40 | uVar17 >> 0x1a) + uVar16;
  uVar17 = ((~uVar18 | uVar19) ^ uVar16) + uVar8 + uVar13 + 0x432aff97;
  uVar8 = (uVar17 * 0x400 | uVar17 >> 0x16) + uVar19;
  uVar17 = uVar18 + uVar11 + ((~uVar16 | uVar8) ^ uVar19) + 0xab9423a7;
  uVar13 = (uVar17 * 0x8000 | uVar17 >> 0x11) + uVar8;
  uVar17 = ((~uVar19 | uVar13) ^ uVar8) + uVar16 + uVar5 + 0xfc93a039;
  uVar17 = (uVar17 * 0x200000 | uVar17 >> 0xb) + uVar13;
  uVar5 = ((~uVar8 | uVar17) ^ uVar13) + uVar19 + uVar23 + 0x655b59c3;
  uVar5 = (uVar5 * 0x40 | uVar5 >> 0x1a) + uVar17;
  uVar12 = uVar8 + uVar12 + ((~uVar13 | uVar5) ^ uVar17) + 0x8f0ccc92;
  uVar23 = (uVar12 * 0x400 | uVar12 >> 0x16) + uVar5;
  uVar12 = (uVar13 + uVar10 + ((~uVar17 | uVar23) ^ uVar5)) - 0x100b83;
  uVar12 = (uVar12 * 0x8000 | uVar12 >> 0x11) + uVar23;
  uVar17 = uVar17 + uVar24 + ((~uVar5 | uVar12) ^ uVar23) + 0x85845dd1;
  uVar17 = (uVar17 * 0x200000 | uVar17 >> 0xb) + uVar12;
  uVar24 = uVar5 + uVar22 + ((~uVar23 | uVar17) ^ uVar12) + 0x6fa87e4f;
  uVar13 = (uVar24 * 0x40 | uVar24 >> 0x1a) + uVar17;
  uVar24 = ((~uVar12 | uVar13) ^ uVar17) + uVar23 + uVar15 + 0xfe2ce6e0;
  uVar5 = (uVar24 * 0x400 | uVar24 >> 0x16) + uVar13;
  uVar24 = uVar12 + uVar9 + ((~uVar17 | uVar5) ^ uVar13) + 0xa3014314;
  uVar24 = (uVar24 * 0x8000 | uVar24 >> 0x11) + uVar5;
  uVar17 = uVar17 + uVar7 + ((~uVar13 | uVar24) ^ uVar5) + 0x4e0811a1;
  uVar17 = (uVar17 * 0x200000 | uVar17 >> 0xb) + uVar24;
  uVar12 = ((~uVar5 | uVar17) ^ uVar24) + uVar13 + uVar21 + 0xf7537e82;
  uVar21 = (uVar12 * 0x40 | uVar12 >> 0x1a) + uVar17;
  uVar12 = uVar5 + uVar14 + ((~uVar24 | uVar21) ^ uVar17) + 0xbd3af235;
  uVar12 = (uVar12 * 0x400 | uVar12 >> 0x16) + uVar21;
  uVar24 = uVar24 + uVar4 + ((~uVar17 | uVar12) ^ uVar21) + 0x2ad7d2bb;
  uVar24 = (uVar24 * 0x8000 | uVar24 >> 0x11) + uVar12;
  uVar17 = uVar17 + uVar6 + ((~uVar21 | uVar24) ^ uVar12) + 0xeb86d391;
  *buf = uVar21 + *buf;
  buf[1] = uVar1 + uVar24 + (uVar17 * 0x200000 | uVar17 >> 0xb);
  buf[2] = uVar24 + uVar2;
  buf[3] = uVar12 + uVar3;
  return;
}

Assistant:

void MD5Transform(
    UWORD32 buf[4], UWORD32 const in[16]) {
  register UWORD32 a, b, c, d;

  a = buf[0];
  b = buf[1];
  c = buf[2];
  d = buf[3];

  MD5STEP(F1, a, b, c, d, in[0] + 0xd76aa478, 7);
  MD5STEP(F1, d, a, b, c, in[1] + 0xe8c7b756, 12);
  MD5STEP(F1, c, d, a, b, in[2] + 0x242070db, 17);
  MD5STEP(F1, b, c, d, a, in[3] + 0xc1bdceee, 22);
  MD5STEP(F1, a, b, c, d, in[4] + 0xf57c0faf, 7);
  MD5STEP(F1, d, a, b, c, in[5] + 0x4787c62a, 12);
  MD5STEP(F1, c, d, a, b, in[6] + 0xa8304613, 17);
  MD5STEP(F1, b, c, d, a, in[7] + 0xfd469501, 22);
  MD5STEP(F1, a, b, c, d, in[8] + 0x698098d8, 7);
  MD5STEP(F1, d, a, b, c, in[9] + 0x8b44f7af, 12);
  MD5STEP(F1, c, d, a, b, in[10] + 0xffff5bb1, 17);
  MD5STEP(F1, b, c, d, a, in[11] + 0x895cd7be, 22);
  MD5STEP(F1, a, b, c, d, in[12] + 0x6b901122, 7);
  MD5STEP(F1, d, a, b, c, in[13] + 0xfd987193, 12);
  MD5STEP(F1, c, d, a, b, in[14] + 0xa679438e, 17);
  MD5STEP(F1, b, c, d, a, in[15] + 0x49b40821, 22);

  MD5STEP(F2, a, b, c, d, in[1] + 0xf61e2562, 5);
  MD5STEP(F2, d, a, b, c, in[6] + 0xc040b340, 9);
  MD5STEP(F2, c, d, a, b, in[11] + 0x265e5a51, 14);
  MD5STEP(F2, b, c, d, a, in[0] + 0xe9b6c7aa, 20);
  MD5STEP(F2, a, b, c, d, in[5] + 0xd62f105d, 5);
  MD5STEP(F2, d, a, b, c, in[10] + 0x02441453, 9);
  MD5STEP(F2, c, d, a, b, in[15] + 0xd8a1e681, 14);
  MD5STEP(F2, b, c, d, a, in[4] + 0xe7d3fbc8, 20);
  MD5STEP(F2, a, b, c, d, in[9] + 0x21e1cde6, 5);
  MD5STEP(F2, d, a, b, c, in[14] + 0xc33707d6, 9);
  MD5STEP(F2, c, d, a, b, in[3] + 0xf4d50d87, 14);
  MD5STEP(F2, b, c, d, a, in[8] + 0x455a14ed, 20);
  MD5STEP(F2, a, b, c, d, in[13] + 0xa9e3e905, 5);
  MD5STEP(F2, d, a, b, c, in[2] + 0xfcefa3f8, 9);
  MD5STEP(F2, c, d, a, b, in[7] + 0x676f02d9, 14);
  MD5STEP(F2, b, c, d, a, in[12] + 0x8d2a4c8a, 20);

  MD5STEP(F3, a, b, c, d, in[5] + 0xfffa3942, 4);
  MD5STEP(F3, d, a, b, c, in[8] + 0x8771f681, 11);
  MD5STEP(F3, c, d, a, b, in[11] + 0x6d9d6122, 16);
  MD5STEP(F3, b, c, d, a, in[14] + 0xfde5380c, 23);
  MD5STEP(F3, a, b, c, d, in[1] + 0xa4beea44, 4);
  MD5STEP(F3, d, a, b, c, in[4] + 0x4bdecfa9, 11);
  MD5STEP(F3, c, d, a, b, in[7] + 0xf6bb4b60, 16);
  MD5STEP(F3, b, c, d, a, in[10] + 0xbebfbc70, 23);
  MD5STEP(F3, a, b, c, d, in[13] + 0x289b7ec6, 4);
  MD5STEP(F3, d, a, b, c, in[0] + 0xeaa127fa, 11);
  MD5STEP(F3, c, d, a, b, in[3] + 0xd4ef3085, 16);
  MD5STEP(F3, b, c, d, a, in[6] + 0x04881d05, 23);
  MD5STEP(F3, a, b, c, d, in[9] + 0xd9d4d039, 4);
  MD5STEP(F3, d, a, b, c, in[12] + 0xe6db99e5, 11);
  MD5STEP(F3, c, d, a, b, in[15] + 0x1fa27cf8, 16);
  MD5STEP(F3, b, c, d, a, in[2] + 0xc4ac5665, 23);

  MD5STEP(F4, a, b, c, d, in[0] + 0xf4292244, 6);
  MD5STEP(F4, d, a, b, c, in[7] + 0x432aff97, 10);
  MD5STEP(F4, c, d, a, b, in[14] + 0xab9423a7, 15);
  MD5STEP(F4, b, c, d, a, in[5] + 0xfc93a039, 21);
  MD5STEP(F4, a, b, c, d, in[12] + 0x655b59c3, 6);
  MD5STEP(F4, d, a, b, c, in[3] + 0x8f0ccc92, 10);
  MD5STEP(F4, c, d, a, b, in[10] + 0xffeff47d, 15);
  MD5STEP(F4, b, c, d, a, in[1] + 0x85845dd1, 21);
  MD5STEP(F4, a, b, c, d, in[8] + 0x6fa87e4f, 6);
  MD5STEP(F4, d, a, b, c, in[15] + 0xfe2ce6e0, 10);
  MD5STEP(F4, c, d, a, b, in[6] + 0xa3014314, 15);
  MD5STEP(F4, b, c, d, a, in[13] + 0x4e0811a1, 21);
  MD5STEP(F4, a, b, c, d, in[4] + 0xf7537e82, 6);
  MD5STEP(F4, d, a, b, c, in[11] + 0xbd3af235, 10);
  MD5STEP(F4, c, d, a, b, in[2] + 0x2ad7d2bb, 15);
  MD5STEP(F4, b, c, d, a, in[9] + 0xeb86d391, 21);

  buf[0] += a;
  buf[1] += b;
  buf[2] += c;
  buf[3] += d;
}